

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O0

SUNErrCode SUNQRAdd_DCGS2(N_Vector *Q,sunrealtype *R,N_Vector df,int m,int mMax,void *QRdata)

{
  int in_ECX;
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  N_Vector in_R9;
  sunrealtype sVar1;
  SUNQRData qrdata;
  sunindextype j;
  SUNContext_conflict sunctx_local_scope_;
  N_Vector in_stack_ffffffffffffffb8;
  N_Vector x;
  N_Vector in_stack_ffffffffffffffc8;
  
  sVar1 = *(sunrealtype *)(*in_RDI + 0x10);
  N_VScale((sunrealtype)in_R9,in_stack_ffffffffffffffb8,(N_Vector)0x1113e6);
  if (0 < in_ECX) {
    N_VDotProdMulti((int)((ulong)sVar1 >> 0x20),in_stack_ffffffffffffffc8,(N_Vector *)in_R9,
                    (sunrealtype *)in_stack_ffffffffffffffb8);
    if (1 < in_ECX) {
      N_VDotProdMulti((int)((ulong)sVar1 >> 0x20),in_stack_ffffffffffffffc8,(N_Vector *)in_R9,
                      (sunrealtype *)in_stack_ffffffffffffffb8);
      N_VLinearCombination
                ((int)((ulong)sVar1 >> 0x20),(sunrealtype *)in_stack_ffffffffffffffc8,
                 (N_Vector *)in_R9,in_stack_ffffffffffffffb8);
      N_VLinearSum(sVar1,in_stack_ffffffffffffffc8,(sunrealtype)in_R9,in_stack_ffffffffffffffb8,
                   (N_Vector)0x1114bd);
      for (in_stack_ffffffffffffffc8 = (N_Vector)0x0;
          (long)in_stack_ffffffffffffffc8 < (long)(in_ECX + -1);
          in_stack_ffffffffffffffc8 = (N_Vector)((long)&in_stack_ffffffffffffffc8->content + 1)) {
        *(double *)
         (in_RSI + ((long)&in_stack_ffffffffffffffc8->content + (long)((in_ECX + -1) * in_R8D)) * 8)
             = *(double *)
                (in_RSI + ((long)&in_stack_ffffffffffffffc8->content +
                          (long)((in_ECX + -1) * in_R8D)) * 8) +
               (double)(&in_R9->sunctx->profiler)[(long)in_stack_ffffffffffffffc8];
      }
    }
    N_VLinearCombination
              ((int)((ulong)sVar1 >> 0x20),(sunrealtype *)in_stack_ffffffffffffffc8,
               (N_Vector *)in_R9,in_stack_ffffffffffffffb8);
    N_VLinearSum(sVar1,in_stack_ffffffffffffffc8,(sunrealtype)in_R9,in_stack_ffffffffffffffb8,
                 (N_Vector)0x111597);
  }
  sVar1 = N_VDotProd(in_R9,in_stack_ffffffffffffffb8);
  *(sunrealtype *)(in_RSI + (long)(in_ECX * in_R8D + in_ECX) * 8) = sVar1;
  if (0.0 < *(double *)(in_RSI + (long)(in_ECX * in_R8D + in_ECX) * 8)) {
    x = (N_Vector)sqrt(*(double *)(in_RSI + (long)(in_ECX * in_R8D + in_ECX) * 8));
  }
  else {
    x = (N_Vector)0x0;
  }
  *(N_Vector *)(in_RSI + (long)(in_ECX * in_R8D + in_ECX) * 8) = x;
  N_VScale((sunrealtype)in_R9,x,(N_Vector)0x11166f);
  return 0;
}

Assistant:

SUNErrCode SUNQRAdd_DCGS2(N_Vector* Q, sunrealtype* R, N_Vector df, int m,
                          int mMax, void* QRdata)
{
  SUNFunctionBegin(Q[0]->sunctx);
  sunindextype j;
  SUNQRData qrdata = (SUNQRData)QRdata;

  N_VScale(ONE, df, qrdata->vtemp);
  SUNCheckLastErr(); /* temp = df */

  if (m > 0)
  {
    /* R(1:k-1,k) = Q_k-1^T df_aa */
    SUNCheckCall(N_VDotProdMulti(m, qrdata->vtemp, Q, R + m * mMax));
    /* Delayed reorthogonalization */
    if (m > 1)
    {
      /* s = Q_k-2^T Q(:,k-1) */
      SUNCheckCall(N_VDotProdMulti(m - 1, Q[m - 1], Q, qrdata->temp_array));

      /* Q(:,k-1) = Q(:,k-1) - Q_k-2 s */
      SUNCheckCall(
        N_VLinearCombination(m - 1, qrdata->temp_array, Q, qrdata->vtemp2));
      N_VLinearSum(ONE, Q[m - 1], -ONE, qrdata->vtemp2, Q[m - 1]);
      SUNCheckLastErr();

      /* R(1:k-2,k-1) = R(1:k-2,k-1) + s */
      for (j = 0; j < m - 1; j++)
      {
        R[(m - 1) * mMax + j] = R[(m - 1) * mMax + j] + qrdata->temp_array[j];
      }
    }

    /* df = df - Q(:,k-1) R(1:k-1,k) */
    SUNCheckCall(N_VLinearCombination(m, R + m * mMax, Q, qrdata->vtemp2));
    N_VLinearSum(ONE, qrdata->vtemp, -ONE, qrdata->vtemp2, qrdata->vtemp);
    SUNCheckLastErr();
  }

  /* R(k,k) = \| df \| */
  R[m * mMax + m] = N_VDotProd(qrdata->vtemp, qrdata->vtemp);
  SUNCheckLastErr();
  R[m * mMax + m] = SUNRsqrt(R[m * mMax + m]);
  /* Q(:,k) = df / R(k,k) */
  N_VScale((1 / R[m * mMax + m]), qrdata->vtemp, Q[m]);
  SUNCheckLastErr();

  return SUN_SUCCESS;
}